

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.c
# Opt level: O1

HT_DurationNs ht_task_scheduler_get_optimal_tick_period(HT_TaskScheduler *task_scheduler)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  HT_DurationNs t;
  ulong uVar6;
  size_t sVar7;
  
  sVar1 = (task_scheduler->tasks).size;
  if (sVar1 == 0) {
    uVar5 = 0;
  }
  else {
    sVar7 = 0;
    uVar5 = 0;
    do {
      uVar6 = *(ulong *)((long)(task_scheduler->tasks).data[sVar7] + 0x10);
      uVar4 = uVar6;
      uVar2 = uVar5;
      uVar3 = uVar5;
      if (uVar6 != 0) {
        while (uVar5 = uVar4, uVar4 = uVar6, uVar3 != 0) {
          uVar6 = uVar2 % uVar4;
          uVar2 = uVar4;
          uVar3 = uVar6;
        }
      }
      sVar7 = sVar7 + 1;
    } while (sVar7 != sVar1);
  }
  return uVar5;
}

Assistant:

HT_DurationNs
ht_task_scheduler_get_optimal_tick_period(HT_TaskScheduler* task_scheduler)
{
    size_t task_pos;
    HT_DurationNs perfect_period = 0;

    for (task_pos = 0; task_pos < task_scheduler->tasks.size; task_pos++)
    {
        HT_DurationNs task_period = HT_TASK(task_scheduler->tasks.data[task_pos])->period;

        if (task_period == 0)
        {
            continue;
        }

        perfect_period = perfect_period == 0 ? task_period : _greatest_common_divisor(perfect_period, task_period);
    }

    return perfect_period;
}